

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Statement> __thiscall Parser::continueStatement(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 uVar2;
  bool bVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  Parser *in_RSI;
  char *this_00;
  char *this_01;
  ptr<Statement> pVar4;
  ptr<Statement> pVar5;
  ptr<Statement> pVar6;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> _Stack_88;
  undefined1 auStack_78 [24];
  pointer pcStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  pointer local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  if (in_RSI->functionCounter != 0) {
    consume(in_RSI);
    consume(in_RSI,StatEnd,"\';\'");
    std::make_shared<ContinueStatement>();
    _Var1._M_pi = a_Stack_20[0]._M_pi;
    a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->filepath)._M_dataplus._M_p = local_28;
    (this->filepath)._M_string_length = (size_type)_Var1._M_pi;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
    pVar4.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    pVar4.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (ptr<Statement>)pVar4.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = "Unexpected \'continue\' outside a function.";
  error(in_RSI,"Unexpected \'continue\' outside a function.");
  if (((Parser *)this_00)->functionCounter != 0) {
    consume((Parser *)this_00);
    consume((Parser *)this_00,StatEnd,"\';\'");
    std::make_shared<BreakStatement>();
    uVar2 = aStack_48._M_allocated_capacity;
    aStack_48._M_allocated_capacity = 0;
    (in_RSI->filepath)._M_dataplus._M_p = pcStack_50;
    (in_RSI->filepath)._M_string_length = uVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_48._M_allocated_capacity);
    pVar5.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX_00._M_pi;
    pVar5.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RSI;
    return (ptr<Statement>)pVar5.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = "Unexpected \'continue\' outside a function.";
  error((Parser *)this_00,"Unexpected \'continue\' outside a function.");
  consume((Parser *)this_01);
  auStack_78._0_8_ = 0;
  auStack_78._8_8_ = 0;
  bVar3 = match((Parser *)this_01,StatEnd);
  if (!bVar3) {
    expression((Parser *)&_Stack_88);
    std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> *)auStack_78,&_Stack_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_88._M_refcount);
  }
  consume((Parser *)this_01,StatEnd,"\';\'");
  std::make_shared<ThrowStatement,std::shared_ptr<Expression>&>
            ((shared_ptr<Expression> *)&_Stack_88);
  _Var1._M_pi = _Stack_88._M_refcount._M_pi;
  _Stack_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((Parser *)this_00)->filepath)._M_dataplus._M_p = (pointer)_Stack_88._M_ptr;
  (((Parser *)this_00)->filepath)._M_string_length = (size_type)_Var1._M_pi;
  _Stack_88._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_88._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_78 + 8));
  pVar6.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX_01._M_pi;
  pVar6.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this_00;
  return (ptr<Statement>)pVar6.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::continueStatement() {
    if(functionCounter == 0)
        error("Unexpected 'continue' outside a function.");

    consume();
    consume(TokenType::StatEnd, "';'");
    return make<ContinueStatement>();
}